

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int scmp(uchar *s1,uchar *s2)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0;
  while( true ) {
    bVar1 = s1[lVar2];
    if ((bVar1 == 0) || (bVar1 != s2[lVar2])) break;
    lVar2 = lVar2 + 1;
  }
  return (uint)bVar1 - (uint)s2[lVar2];
}

Assistant:

int scmp( unsigned char *s1, unsigned char *s2 )
{
    while( *s1 != '\0' && *s1 == *s2 )
    {
        s1++;
        s2++;
    }
    return( *s1-*s2 );
}